

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O3

EndOfGameType __thiscall hanabi_learning_env::HanabiState::EndOfGameStatus(HanabiState *this)

{
  EndOfGameType EVar1;
  int *piVar2;
  int iVar3;
  
  if (0 < this->life_tokens_) {
    iVar3 = 0;
    for (piVar2 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar2 != (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
      iVar3 = iVar3 + *piVar2;
    }
    EVar1 = kCompletedFireworks;
    if (iVar3 < this->parent_game_->num_ranks_ * this->parent_game_->num_colors_) {
      EVar1 = (uint)(this->turns_to_play_ < 1) * 2;
    }
    return EVar1;
  }
  return kOutOfLifeTokens;
}

Assistant:

HanabiState::EndOfGameType HanabiState::EndOfGameStatus() const {
  if (LifeTokens() < 1) {
    return kOutOfLifeTokens;
  }
  if (Score() >= ParentGame()->NumColors() * ParentGame()->NumRanks()) {
    return kCompletedFireworks;
  }
  if (turns_to_play_ <= 0) {
    return kOutOfCards;
  }
  return kNotFinished;
}